

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall
UKF::PredictMeanAndCovariance(UKF *this,MatrixXd *Xsig_pred,VectorXd *x_out,MatrixXd *P_out)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  DenseIndex DVar5;
  DenseIndex DVar6;
  UKF *pUVar7;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar8;
  int iVar9;
  Index size;
  double *pdVar10;
  undefined8 *puVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  Index othersize;
  long lVar15;
  long lVar16;
  long lVar17;
  Index othersize_1;
  Index size_1;
  bool bVar18;
  double dVar19;
  VectorXd x_diff;
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  UKF *local_a8;
  MatrixXd *local_a0;
  undefined1 *local_98;
  double local_90;
  undefined1 *local_88;
  void *local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_60;
  double local_58;
  undefined8 uStack_50;
  MatrixXd *local_48;
  PlainObject *local_40;
  
  local_a8 = this;
  local_a0 = Xsig_pred;
  local_68 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P_out;
  local_60 = &x_out->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  if ((PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
       ::x == '\0') &&
     (iVar9 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                   ::x), iVar9 != 0)) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&PredictMeanAndCovariance::x,(long)this->n_x_);
    __cxa_atexit(Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~PlainObjectBase,
                 &PredictMeanAndCovariance::x,&__dso_handle);
    __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                         ::x);
    this = local_a8;
  }
  if ((PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
       ::P == '\0') &&
     (iVar9 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                   ::P), iVar9 != 0)) {
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&PredictMeanAndCovariance::P,&this->n_x_,&this->n_x_)
    ;
    __cxa_atexit(Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PlainObjectBase
                 ,&PredictMeanAndCovariance::P,&__dso_handle);
    __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                         ::P);
    this = local_a8;
  }
  DVar5 = PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows;
  if (PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows < 0) {
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_00108b92:
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,pcVar13);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&PredictMeanAndCovariance::x.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1);
  DVar6 = PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows;
  if (PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows == DVar5) {
    uVar12 = PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
             (PredictMeanAndCovariance::x.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows >>
             0x3f) & 0xfffffffffffffffe;
    if (1 < PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      lVar15 = 0;
      do {
        pdVar2 = PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 lVar15;
        *pdVar2 = 0.0;
        pdVar2[1] = 0.0;
        lVar15 = lVar15 + 2;
      } while (lVar15 < (long)uVar12);
    }
    if ((long)uVar12 < DVar6) {
      memset(PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             (DVar6 / 2) * 2,0,DVar6 * 8 + (DVar6 / 2) * -0x10);
    }
    if (-1 < this->n_aug_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar15) goto LAB_00108972;
        pdVar2 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar3 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if ((lVar3 < 0) && (pdVar2 + lVar3 * lVar15 != (double *)0x0)) goto LAB_001089b0;
        if ((local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar15) goto LAB_00108991;
        if (PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar3
           ) {
          pcVar13 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_00108a48;
        }
        local_58 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar15];
        uStack_50 = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&PredictMeanAndCovariance::x.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar3,1);
        DVar5 = PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != lVar3
           ) {
          pcVar13 = 
          "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
          ;
          goto LAB_00108a67;
        }
        uVar12 = PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                 (PredictMeanAndCovariance::x.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows >>
                 0x3f) & 0xfffffffffffffffe;
        if (1 < PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar16 = 0;
          do {
            dVar19 = (PredictMeanAndCovariance::x.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data + lVar16)[1];
            pdVar10 = (double *)((long)pdVar2 + lVar16 * 8 + lVar3 * lVar17);
            dVar4 = pdVar10[1];
            pdVar1 = PredictMeanAndCovariance::x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + lVar16;
            *pdVar1 = *pdVar10 * local_58 +
                      PredictMeanAndCovariance::x.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[lVar16];
            pdVar1[1] = dVar4 * local_58 + dVar19;
            lVar16 = lVar16 + 2;
          } while (lVar16 < (long)uVar12);
        }
        pdVar10 = PredictMeanAndCovariance::x.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if ((long)uVar12 < DVar5) {
          do {
            pdVar10[uVar12] =
                 *(double *)((long)pdVar2 + uVar12 * 8 + lVar3 * lVar17) * local_58 +
                 pdVar10[uVar12];
            uVar12 = uVar12 + 1;
          } while (DVar5 != uVar12);
        }
        lVar17 = lVar17 + 8;
        bVar18 = SBORROW8(lVar15,(long)this->n_aug_ * 2);
        lVar3 = lVar15 + (long)this->n_aug_ * -2;
        lVar15 = lVar15 + 1;
      } while (bVar18 != lVar3 < 0);
    }
    local_98 = (undefined1 *)
               PredictMeanAndCovariance::P.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_90 = (double)PredictMeanAndCovariance::P.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols;
    local_88 = (undefined1 *)0x0;
    if ((PredictMeanAndCovariance::P.
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols |
        PredictMeanAndCovariance::P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_storage.m_rows) < 0) {
      pcVar13 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_00108b92;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&PredictMeanAndCovariance::P,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_98);
    if (-1 < this->n_aug_) {
      lVar17 = 0;
      lVar15 = 0;
      do {
        pdVar2 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar3 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if ((lVar3 < 0) && (pdVar2 + lVar3 * lVar15 != (double *)0x0)) {
LAB_001089b0:
          __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                        ,0x94,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                       );
        }
        if ((local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar15) {
LAB_00108991:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                        ,0x76,
                        "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        if (lVar3 != PredictMeanAndCovariance::x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           ) {
          pcVar13 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
LAB_00108a48:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x84,pcVar13);
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  (&local_b8,
                   PredictMeanAndCovariance::x.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                   PredictMeanAndCovariance::x.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        DVar5 = PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                        ,0xf1,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        pdVar10 = local_b8.m_data;
        if (local_b8.m_rows !=
            PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          free(local_b8.m_data);
          if (DVar5 == 0) {
            local_b8.m_data = (double *)0x0;
            pdVar10 = local_b8.m_data;
          }
          else if (((ulong)DVar5 >> 0x3d != 0) ||
                  (pdVar10 = (double *)malloc(DVar5 * 8), pdVar10 == (double *)0x0)) {
            puVar11 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar11 = operator_delete;
            __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
        local_b8.m_data = pdVar10;
        pUVar7 = local_a8;
        local_b8.m_rows = DVar5;
        if (DVar5 != PredictMeanAndCovariance::x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           ) {
          pcVar13 = 
          "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_00108a67;
        }
        uVar12 = DVar5 & 0x7ffffffffffffffe;
        if (1 < DVar5) {
          uVar14 = 0;
          do {
            pdVar10 = (double *)((long)pdVar2 + uVar14 * 8 + lVar3 * lVar17);
            dVar19 = pdVar10[1];
            dVar4 = (PredictMeanAndCovariance::x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    + uVar14)[1];
            local_b8.m_data[uVar14] =
                 *pdVar10 -
                 PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar14];
            (local_b8.m_data + uVar14)[1] = dVar19 - dVar4;
            uVar14 = uVar14 + 2;
          } while (uVar14 < uVar12);
        }
        pdVar10 = PredictMeanAndCovariance::x.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if ((long)uVar12 < DVar5) {
          do {
            local_b8.m_data[uVar12] =
                 *(double *)((long)pdVar2 + uVar12 * 8 + lVar3 * lVar17) - pdVar10[uVar12];
            uVar12 = uVar12 + 1;
          } while (DVar5 != uVar12);
        }
        if (DVar5 < 4) {
LAB_00108972:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar19 = local_b8.m_data[3];
        while (3.141592653589793 < dVar19) {
          dVar19 = dVar19 + -6.283185307179586;
          local_b8.m_data[3] = dVar19;
          if (DVar5 < 4) goto LAB_00108972;
        }
        dVar19 = local_b8.m_data[3];
        if (dVar19 < -3.141592653589793) {
          do {
            dVar19 = dVar19 + 6.283185307179586;
          } while (dVar19 < -3.141592653589793);
          local_b8.m_data[3] = dVar19;
        }
        if ((local_a8->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar15) goto LAB_00108972;
        local_90 = (local_a8->weights_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [lVar15];
        local_80 = (void *)0x0;
        uStack_78 = 0;
        local_70 = 0;
        local_48 = &PredictMeanAndCovariance::P;
        local_98 = (undefined1 *)&local_b8;
        local_88 = (undefined1 *)&local_b8;
        local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_98);
        if ((PredictMeanAndCovariance::P.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
             *(long *)(local_98 + 8)) ||
           (PredictMeanAndCovariance::P.
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols !=
            *(long *)(local_88 + 8))) {
          pcVar13 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
          ;
          goto LAB_00108a48;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                   &PredictMeanAndCovariance::P,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                    *)&local_48);
        free(local_80);
        free(local_b8.m_data);
        lVar17 = lVar17 + 8;
        bVar18 = SBORROW8(lVar15,(long)pUVar7->n_aug_ * 2);
        lVar3 = lVar15 + (long)pUVar7->n_aug_ * -2;
        lVar15 = lVar15 + 1;
      } while (bVar18 != lVar3 < 0);
    }
    pPVar8 = local_60;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (local_60,PredictMeanAndCovariance::x.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,1);
    uVar12 = (pPVar8->m_storage).m_rows;
    if (uVar12 == PredictMeanAndCovariance::x.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar14 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar12) {
        lVar15 = 0;
        do {
          dVar19 = (PredictMeanAndCovariance::x.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + lVar15)[1];
          pdVar2 = (pPVar8->m_storage).m_data + lVar15;
          *pdVar2 = PredictMeanAndCovariance::x.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [lVar15];
          pdVar2[1] = dVar19;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar14);
      }
      pdVar2 = PredictMeanAndCovariance::x.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if ((long)uVar14 < (long)uVar12) {
        pdVar10 = (pPVar8->m_storage).m_data;
        do {
          pdVar10[uVar14] = pdVar2[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          &PredictMeanAndCovariance::P);
      return;
    }
    pcVar13 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    pcVar13 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
    ;
  }
LAB_00108a67:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar13);
}

Assistant:

void UKF::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x_out, MatrixXd &P_out) {
 
  //create vector for predicted state
  static VectorXd x = VectorXd(n_x_);

  //create covariance matrix for prediction
  static MatrixXd P = MatrixXd(n_x_, n_x_);

  //predicted state mean
  x.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x = x + weights_(i) * Xsig_pred.col(i);
  }

  //predicted state covariance matrix
  P.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred.col(i) - x;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3)-=2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3)+=2.*M_PI;

    P = P + weights_(i) * x_diff * x_diff.transpose() ;

  }

  //print result
  //std::cout << "Predicted state px,py,v,psi,psi_dot" << std::endl;
  //std::cout << x << std::endl;
  //std::cout << "Predicted covariance matrix P " << std::endl;
  //std::cout << P << std::endl;

  //write result
  x_out = x;
  P_out = P;

  return;
}